

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * kj::str<bool>(String *__return_storage_ptr__,bool *params)

{
  char *__dest;
  size_t __n;
  StringPtr SVar1;
  
  SVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,*params);
  heapString(__return_storage_ptr__,SVar1.content.size_ - 1);
  __n = SVar1.content.size_ - 1;
  if (__n != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,SVar1.content.ptr,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}